

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscribedsignal.cpp
# Opt level: O0

void __thiscall
hbm::streaming::SubscribedSignal::interpretValuesAsDouble
          (SubscribedSignal *this,uchar *pData,size_t count)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  unsigned_long uVar4;
  long lVar5;
  runtime_error *prVar6;
  uchar **p;
  ulong in_RDX;
  long in_RDI;
  float fVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  size_t i_13;
  size_t i_12;
  size_t i_11;
  size_t i_10;
  size_t i_9;
  size_t i_8;
  size_t i_7;
  size_t i_6;
  size_t i_5;
  size_t i_4;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  size_t i;
  uchar **in_stack_fffffffffffffec8;
  extract<unsigned_char,_(hbm::streaming::endian)0> *in_stack_fffffffffffffed0;
  uchar **in_stack_fffffffffffffed8;
  extract<double,_(hbm::streaming::endian)0> *in_stack_fffffffffffffee0;
  ulong local_100;
  ulong local_f0;
  ulong local_e0;
  ulong local_d0;
  ulong local_c0;
  ulong local_b0;
  ulong local_a0;
  ulong local_80;
  ulong local_70;
  ulong local_60;
  ulong local_50;
  ulong local_40;
  ulong local_30;
  ulong local_20;
  
  if ((*(byte *)(in_RDI + 0x5c) & 1) == 0) {
    p = (uchar **)(ulong)*(uint *)(in_RDI + 0x60);
    switch(p) {
    case (uchar **)0x0:
      for (local_c0 = 0; local_c0 < in_RDX; local_c0 = local_c0 + 1) {
        uVar2 = extract<unsigned_int,_(hbm::streaming::endian)0>::operator()
                          ((extract<unsigned_int,_(hbm::streaming::endian)0> *)
                           in_stack_fffffffffffffee0,p);
        *(double *)(in_RDI + 0x80 + local_c0 * 8) = (double)uVar2;
      }
      break;
    case (uchar **)0x1:
      for (local_d0 = 0; local_d0 < in_RDX; local_d0 = local_d0 + 1) {
        iVar3 = extract<int,_(hbm::streaming::endian)0>::operator()
                          ((extract<int,_(hbm::streaming::endian)0> *)in_stack_fffffffffffffee0,p);
        *(double *)(in_RDI + 0x80 + local_d0 * 8) = (double)iVar3;
      }
      break;
    case (uchar **)0x2:
      for (local_a0 = 0; local_a0 < in_RDX; local_a0 = local_a0 + 1) {
        fVar7 = extract<float,_(hbm::streaming::endian)0>::operator()
                          ((extract<float,_(hbm::streaming::endian)0> *)in_stack_fffffffffffffee0,p)
        ;
        *(double *)(in_RDI + 0x80 + local_a0 * 8) = (double)fVar7;
      }
      break;
    case (uchar **)0x3:
      for (local_e0 = 0; local_e0 < in_RDX; local_e0 = local_e0 + 1) {
        uVar4 = extract<unsigned_long,_(hbm::streaming::endian)0>::operator()
                          ((extract<unsigned_long,_(hbm::streaming::endian)0> *)
                           in_stack_fffffffffffffee0,p);
        auVar10._8_4_ = (int)(uVar4 >> 0x20);
        auVar10._0_8_ = uVar4;
        auVar10._12_4_ = 0x45300000;
        *(double *)(in_RDI + 0x80 + local_e0 * 8) =
             (auVar10._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0);
      }
      break;
    case (uchar **)0x4:
      for (local_f0 = 0; local_f0 < in_RDX; local_f0 = local_f0 + 1) {
        lVar5 = extract<long,_(hbm::streaming::endian)0>::operator()
                          ((extract<long,_(hbm::streaming::endian)0> *)in_stack_fffffffffffffee0,p);
        *(double *)(in_RDI + 0x80 + local_f0 * 8) = (double)lVar5;
      }
      break;
    case (uchar **)0x5:
      for (local_b0 = 0; local_b0 < in_RDX; local_b0 = local_b0 + 1) {
        dVar8 = extract<double,_(hbm::streaming::endian)0>::operator()(in_stack_fffffffffffffee0,p);
        *(double *)(in_RDI + 0x80 + local_b0 * 8) = dVar8;
      }
      break;
    case (uchar **)0x6:
      for (local_100 = 0; local_100 < in_RDX; local_100 = local_100 + 1) {
        bVar1 = extract<unsigned_char,_(hbm::streaming::endian)0>::operator()
                          (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        *(double *)(in_RDI + 0x80 + local_100 * 8) = (double)bVar1;
      }
      break;
    default:
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"datatype not supported!");
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    switch(*(undefined4 *)(in_RDI + 0x60)) {
    case 0:
      for (local_40 = 0; local_40 < in_RDX; local_40 = local_40 + 1) {
        uVar2 = extract<unsigned_int,_(hbm::streaming::endian)1>::operator()
                          ((extract<unsigned_int,_(hbm::streaming::endian)1> *)
                           in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        *(double *)(in_RDI + 0x80 + local_40 * 8) = (double)uVar2;
      }
      break;
    case 1:
      for (local_50 = 0; local_50 < in_RDX; local_50 = local_50 + 1) {
        iVar3 = extract<int,_(hbm::streaming::endian)1>::operator()
                          ((extract<int,_(hbm::streaming::endian)1> *)in_stack_fffffffffffffee0,
                           in_stack_fffffffffffffed8);
        *(double *)(in_RDI + 0x80 + local_50 * 8) = (double)iVar3;
      }
      break;
    case 2:
      for (local_20 = 0; local_20 < in_RDX; local_20 = local_20 + 1) {
        fVar7 = extract<float,_(hbm::streaming::endian)1>::operator()
                          ((extract<float,_(hbm::streaming::endian)1> *)in_stack_fffffffffffffee0,
                           in_stack_fffffffffffffed8);
        *(double *)(in_RDI + 0x80 + local_20 * 8) = (double)fVar7;
      }
      break;
    case 3:
      for (local_60 = 0; local_60 < in_RDX; local_60 = local_60 + 1) {
        uVar4 = extract<unsigned_long,_(hbm::streaming::endian)1>::operator()
                          ((extract<unsigned_long,_(hbm::streaming::endian)1> *)
                           in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        auVar9._8_4_ = (int)(uVar4 >> 0x20);
        auVar9._0_8_ = uVar4;
        auVar9._12_4_ = 0x45300000;
        *(double *)(in_RDI + 0x80 + local_60 * 8) =
             (auVar9._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0);
      }
      break;
    case 4:
      for (local_70 = 0; local_70 < in_RDX; local_70 = local_70 + 1) {
        lVar5 = extract<long,_(hbm::streaming::endian)1>::operator()
                          ((extract<long,_(hbm::streaming::endian)1> *)in_stack_fffffffffffffee0,
                           in_stack_fffffffffffffed8);
        *(double *)(in_RDI + 0x80 + local_70 * 8) = (double)lVar5;
      }
      break;
    case 5:
      for (local_30 = 0; local_30 < in_RDX; local_30 = local_30 + 1) {
        dVar8 = extract<double,_(hbm::streaming::endian)1>::operator()
                          ((extract<double,_(hbm::streaming::endian)1> *)in_stack_fffffffffffffee0,
                           in_stack_fffffffffffffed8);
        *(double *)(in_RDI + 0x80 + local_30 * 8) = dVar8;
      }
      break;
    case 6:
      for (local_80 = 0; local_80 < in_RDX; local_80 = local_80 + 1) {
        bVar1 = extract<unsigned_char,_(hbm::streaming::endian)1>::operator()
                          ((extract<unsigned_char,_(hbm::streaming::endian)1> *)
                           in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        *(double *)(in_RDI + 0x80 + local_80 * 8) = (double)bVar1;
      }
      break;
    default:
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"datatype not supported!");
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void SubscribedSignal::interpretValuesAsDouble(unsigned char *pData, size_t count)
		{
			if(m_dataIsBigEndian) {
				switch (m_dataValueType) {
					case DATATYPE_REAL32:
						for(size_t i=0; i<count; ++i) {
							m_valueBuffer[i] = hbm::streaming::extract<float, hbm::streaming::big>()(&pData);
						}
						break;

					case DATATYPE_REAL64:
						for(size_t i=0; i<count; ++i) {
							m_valueBuffer[i] = hbm::streaming::extract<double, hbm::streaming::big>()(&pData);
						}
						break;

					case DATATYPE_U32:
						for(size_t i=0; i<count; ++i) {
							m_valueBuffer[i] = hbm::streaming::extract<uint32_t, hbm::streaming::big>()(&pData);
						}
						break;

					case DATATYPE_S32:
						for(size_t i=0; i<count; ++i) {
							m_valueBuffer[i] = hbm::streaming::extract<int32_t, hbm::streaming::big>()(&pData);
						}
						break;

					case DATATYPE_U64:
						for(size_t i=0; i<count; ++i) {
							m_valueBuffer[i] = static_cast < double > (hbm::streaming::extract<uint64_t, hbm::streaming::big>()(&pData));
						}
						break;

					case DATATYPE_S64:
						for(size_t i=0; i<count; ++i) {
							m_valueBuffer[i] = static_cast < double > (hbm::streaming::extract<int64_t, hbm::streaming::big>()(&pData));
						}
						break;
					case DATATYPE_CANRAW:
						for(size_t i=0; i<count; ++i) {
							m_valueBuffer[i] = hbm::streaming::extract<uint8_t, hbm::streaming::big>()(&pData);
						}
						break;

					default:
						throw std::runtime_error("datatype not supported!");
						break;
				}
			} else {
				switch (m_dataValueType) {
					case DATATYPE_REAL32:
						for(size_t i=0; i<count; ++i) {
							m_valueBuffer[i] = hbm::streaming::extract<float, hbm::streaming::little>()(&pData);
						}
						break;

					case DATATYPE_REAL64:
						for(size_t i=0; i<count; ++i) {
							m_valueBuffer[i] = hbm::streaming::extract<double, hbm::streaming::little>()(&pData);
						}
						break;

					case DATATYPE_U32:
						for(size_t i=0; i<count; ++i) {
							m_valueBuffer[i] = hbm::streaming::extract<uint32_t, hbm::streaming::little>()(&pData);
						}
						break;

					case DATATYPE_S32:
						for(size_t i=0; i<count; ++i) {
							m_valueBuffer[i] = hbm::streaming::extract<int32_t, hbm::streaming::little>()(&pData);
						}
						break;

					case DATATYPE_U64:
						for(size_t i=0; i<count; ++i) {
							m_valueBuffer[i] = static_cast < double > (hbm::streaming::extract<uint64_t, hbm::streaming::little>()(&pData));
						}
						break;

					case DATATYPE_S64:
						for(size_t i=0; i<count; ++i) {
							m_valueBuffer[i] = static_cast < double > (hbm::streaming::extract<int64_t, hbm::streaming::little>()(&pData));
						}
						break;
                    case DATATYPE_CANRAW:
                        for(size_t i=0; i<count; ++i) {
                            m_valueBuffer[i] = hbm::streaming::extract<uint8_t, hbm::streaming::little>()(&pData);
                        }
                        break;

					default:
						throw std::runtime_error("datatype not supported!");
						break;
				}
			}
		}